

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result,FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_01;
  void **ppvVar1;
  VoidPtr VVar2;
  byte bVar3;
  uint array_size;
  ushort *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  size_t sVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  size_type symbol;
  undefined8 alloc_00;
  int iVar6;
  undefined4 index;
  int iVar7;
  int extraout_EAX;
  undefined8 *puVar8;
  DescriptorNames DVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar10;
  EnumValueDescriptor *pEVar11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *pVVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar13;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  string *psVar14;
  Tables *pTVar15;
  DescriptorPool *pDVar16;
  Rep *pRVar17;
  Nonnull<const_char_*> pcVar18;
  undefined8 extraout_RAX;
  char *pcVar19;
  long lVar20;
  SymbolBase *pSVar21;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  EnumDescriptor *pEVar23;
  ulong uVar24;
  long lVar25;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  iterator iVar26;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view option_name;
  string_view name_00;
  string_view proto_name;
  string_view full_name_00;
  EnumValueDescriptor *value;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  RepeatedPtrFieldBase *local_b0;
  undefined1 local_a8 [80];
  code *pcStack_58;
  undefined8 local_50;
  code *pcStack_48;
  undefined8 local_40;
  code *pcStack_38;
  
  if (parent == (Descriptor *)0x0) {
    psVar14 = this->file_->package_;
    pcVar19 = (psVar14->_M_dataplus)._M_p;
    uVar24 = psVar14->_M_string_length;
  }
  else {
    pcVar19 = (parent->all_names_).payload_;
    uVar24 = (ulong)*(ushort *)(pcVar19 + 2);
    pcVar19 = pcVar19 + ~uVar24;
  }
  puVar8 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = pcVar19;
  scope._M_len = uVar24;
  proto_name._M_str = (char *)*puVar8;
  proto_name._M_len = puVar8[1];
  local_d0.field_2._8_8_ = alloc;
  DVar9 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar9.payload_;
  puVar8 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar9.payload_ + 2);
  full_name_00._M_str = DVar9.payload_ + ~full_name_00._M_len;
  name._M_str = (char *)*puVar8;
  name._M_len = puVar8[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  bVar3 = result->field_0x1;
  result->field_0x1 = bVar3 & 0xfc;
  result->field_0x1 = bVar3 & 0xf0 | (*(byte *)((long)&proto->field_0 + 0x60) & 3) << 2;
  local_d0.field_2._M_allocated_capacity = (size_type)parent;
  if (*(int *)((long)&proto->field_0 + 0x10) == 0) {
    pcVar19 = (result->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar19 + 2);
    element_name._M_str = pcVar19 + ~element_name._M_len;
    full_name_00._M_str =
         (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          *)0x0;
    AddError(this,element_name,&proto->super_Message,NAME,"Enums must contain at least one value.");
  }
  this_00 = &(proto->field_0)._impl_.value_;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    uVar24 = 0;
    do {
      pVVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          (&this_00->super_RepeatedPtrFieldBase,(int)uVar24);
      iVar7 = (pVVar10->field_0)._impl_.number_;
      pVVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          (&this_00->super_RepeatedPtrFieldBase,0);
      if (((long)(pVVar10->field_0)._impl_.number_ + uVar24 != (long)iVar7) ||
         (result->sequential_value_limit_ = (int16_t)uVar24, 0xfffd < uVar24)) break;
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)*(int *)((long)&proto->field_0 + 0x10));
  }
  alloc_00 = local_d0.field_2._8_8_;
  array_size = *(uint *)((long)&proto->field_0 + 0x10);
  pVVar10 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
             *)(ulong)array_size;
  result->value_count_ = array_size;
  local_b0 = &this_00->super_RepeatedPtrFieldBase;
  pEVar11 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumValueDescriptor>
                      ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        *)local_d0.field_2._8_8_,array_size);
  result->values_ = pEVar11;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    lVar20 = 0;
    lVar25 = 0;
    do {
      pVVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          (local_b0,(int)lVar25);
      full_name_00._M_str = alloc_00;
      BuildEnumValue(this,pVVar10,result,
                     (EnumValueDescriptor *)(&result->values_->super_SymbolBaseN<0> + lVar20),
                     (FlatAllocator *)alloc_00);
      lVar25 = lVar25 + 1;
      lVar20 = lVar20 + 0x30;
    } while (lVar25 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar7 = *(int *)((long)&proto->field_0 + 0x28);
  result->reserved_range_count_ = iVar7;
  lVar20 = *(long *)alloc_00;
  if (lVar20 == 0) {
    BuildEnum((DescriptorBuilder *)local_a8);
    pEVar23 = result;
    iVar6 = extraout_EAX;
  }
  else {
    iVar6 = (((TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               *)(alloc_00 + 0xa8))->payload_).super_Base<char>.value;
    pEVar23 = (EnumDescriptor *)(long)iVar6;
    iVar6 = iVar6 + iVar7 * 8;
    (((TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
       *)(alloc_00 + 0xa8))->payload_).super_Base<char>.value = iVar6;
    iVar7 = (((TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               *)(alloc_00 + 0x70))->payload_).super_Base<char>.value;
    pVVar10 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
               *)(long)iVar7;
    local_d0._M_string_length = (size_type)result;
    if (iVar6 <= iVar7) {
      pcVar18 = (Nonnull<const_char_*>)0x0;
      goto LAB_0021c213;
    }
  }
  pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                      ((long)iVar6,(long)pVVar10,"used <= total_.template Get<TypeToUse>()");
LAB_0021c213:
  symbol = local_d0._M_string_length;
  if (pcVar18 != (Nonnull<const_char_*>)0x0) {
    BuildEnum();
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_a8);
    _Unwind_Resume(extraout_RAX);
  }
  *(SymbolBase **)(local_d0._M_string_length + 0x48) = &pEVar23->super_SymbolBase + lVar20;
  if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
    lVar20 = 0;
    lVar25 = 0;
    do {
      pVVar12 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                          (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                           (int)lVar25);
      BuildReservedRange(this,pVVar12,(EnumDescriptor *)symbol,
                         (ReservedRange *)(*(long *)(symbol + 0x48) + lVar20),
                         (FlatAllocator *)full_name_00._M_str);
      lVar25 = lVar25 + 1;
      lVar20 = lVar20 + 8;
    } while (lVar25 < *(int *)((long)&proto->field_0 + 0x28));
  }
  full_name_00._M_str = local_d0.field_2._8_8_;
  iVar7 = *(int *)((long)&proto->field_0 + 0x40);
  *(int *)(symbol + 0x44) = iVar7;
  ppbVar13 = protobuf::(anonymous_namespace)::
             FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
             ::AllocateArray<std::__cxx11::string_const*>
                       ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                         *)local_d0.field_2._8_8_,iVar7);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(symbol + 0x50) = ppbVar13
  ;
  if (0 < (long)iVar7) {
    lVar20 = 0;
    do {
      in = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                     (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,(int)lVar20
                     );
      psVar14 = protobuf::(anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateStrings<std::__cxx11::string_const&>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)full_name_00._M_str,in);
      *(string **)(*(long *)(symbol + 0x50) + lVar20 * 8) = psVar14;
      lVar20 = lVar20 + 1;
    } while (iVar7 != lVar20);
  }
  option_name._M_str = "google.protobuf.EnumOptions";
  option_name._M_len = 0x1b;
  AllocateOptions<google::protobuf::EnumDescriptor>
            (this,proto,(EnumDescriptor *)symbol,3,option_name,(FlatAllocator *)full_name_00._M_str)
  ;
  puVar4 = *(ushort **)(symbol + 8);
  full_name._M_len = (ulong)puVar4[1];
  full_name._M_str = (char *)(~full_name._M_len + (long)puVar4);
  name_00._M_len = (ulong)*puVar4;
  name_00._M_str = (char *)(~name_00._M_len + (long)puVar4);
  *(uint8_t *)symbol = '\x04';
  AddSymbol(this,full_name,(void *)local_d0.field_2._M_allocated_capacity,name_00,
            &proto->super_Message,(Symbol)symbol);
  if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
    this_01 = &(proto->field_0)._impl_.reserved_range_;
    index = 0;
    do {
      pTVar15 = (Tables *)
                internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                          (&this_01->super_RepeatedPtrFieldBase,index);
      iVar7 = index + 1;
      local_d0.field_2._M_allocated_capacity._0_4_ = iVar7;
      local_d0.field_2._8_8_ =
           (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            *)(ulong)(uint)index;
      if (iVar7 < *(int *)((long)&proto->field_0 + 0x28)) {
        do {
          pDVar16 = (DescriptorPool *)
                    internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                              (&this_01->super_RepeatedPtrFieldBase,iVar7);
          if ((*(int *)&pDVar16->fallback_database_ <=
               *(int *)((long)&(pTVar15->known_bad_files_).
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.capacity_ + 4)) &&
             ((int)(pTVar15->known_bad_files_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_ <= *(int *)((long)&pDVar16->fallback_database_ + 4))) {
            lVar20 = *(long *)(local_d0._M_string_length + 8);
            uVar24 = (ulong)*(ushort *)(lVar20 + 2);
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                (&this_01->super_RepeatedPtrFieldBase,(int)local_d0.field_2._8_8_);
            pcStack_38 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
            ;
            local_40 = local_a8;
            make_error.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
            ;
            make_error.ptr_.obj = (void *)local_40;
            element_name_00._M_str = (char *)(~uVar24 + lVar20);
            element_name_00._M_len = uVar24;
            local_a8._0_8_ = pDVar16;
            local_a8._8_8_ = pTVar15;
            AddError(this,element_name_00,&pVVar12->super_Message,NUMBER,make_error);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < *(int *)((long)&proto->field_0 + 0x28));
      }
      index = local_d0.field_2._M_allocated_capacity._0_4_;
    } while ((int)local_d0.field_2._M_allocated_capacity._0_4_ <
             *(int *)((long)&proto->field_0 + 0x28));
  }
  local_a8._0_8_ = (DescriptorPool *)0x1;
  local_a8._8_8_ = (Tables *)0x0;
  this_02 = &(proto->field_0)._impl_.reserved_name_;
  pRVar22 = this_02;
  if ((*(byte *)((long)&proto->field_0 + 0x38) & 1) != 0) {
    pRVar17 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    pRVar22 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)pRVar17->elements;
  }
  if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar17 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    this_02 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)pRVar17->elements;
  }
  ppvVar1 = &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
            *(int *)((long)&proto->field_0 + 0x40);
  if (pRVar22 !=
      (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)ppvVar1) {
    VVar2.obj = local_a8 + 0x20;
    do {
      key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pRVar22->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
      local_d0._M_dataplus._M_p = local_a8;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::EmplaceDecomposable::operator()
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                  *)VVar2.obj,&local_d0,key_00,key_00);
      if (local_a8[0x30] == '\0') {
        pcStack_48 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
        ;
        make_error_00.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
        ;
        make_error_00.ptr_.obj = VVar2.obj;
        element_name_01._M_str = (key_00->_M_dataplus)._M_p;
        element_name_01._M_len = key_00->_M_string_length;
        local_a8._32_8_ = key_00;
        local_50 = VVar2.obj;
        AddError(this,element_name_01,&proto->super_Message,NAME,make_error_00);
      }
      pRVar22 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&(pRVar22->super_RepeatedPtrFieldBase).current_size_;
    } while (pRVar22 !=
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)ppvVar1);
  }
  if (0 < *(int *)(local_d0._M_string_length + 4)) {
    lVar20 = 0;
    VVar2.obj = local_a8 + 0x20;
    do {
      local_d0._M_dataplus._M_p =
           (pointer)(lVar20 * 0x30 + *(long *)(local_d0._M_string_length + 0x38));
      if (0 < *(int *)(local_d0._M_string_length + 0x40)) {
        lVar25 = 0;
        pSVar21 = (SymbolBase *)local_d0._M_string_length;
        do {
          if ((*(int *)(*(long *)(pSVar21 + 0x48) + lVar25 * 8) <=
               *(int *)(local_d0._M_dataplus._M_p + 4)) &&
             (*(int *)(local_d0._M_dataplus._M_p + 4) <=
              *(int *)(*(long *)(pSVar21 + 0x48) + 4 + lVar25 * 8))) {
            pcVar19 = *(char **)(*(long *)(local_d0._M_dataplus._M_p + 8) + 0x20);
            sVar5 = *(size_t *)(*(long *)(local_d0._M_dataplus._M_p + 8) + 0x28);
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase
                                 ,(int)lVar25);
            pcStack_58 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
            ;
            make_error_01.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
            ;
            make_error_01.ptr_.obj = VVar2.obj;
            element_name_02._M_str = pcVar19;
            element_name_02._M_len = sVar5;
            local_a8._32_8_ = &local_d0;
            local_a8._72_8_ = VVar2.obj;
            AddError(this,element_name_02,&pVVar12->super_Message,NUMBER,make_error_01);
            pSVar21 = (SymbolBase *)local_d0._M_string_length;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < *(int *)(pSVar21 + 0x40));
      }
      local_a8._40_8_ = **(intptr_t **)(local_d0._M_dataplus._M_p + 8);
      local_a8._32_8_ = (*(intptr_t **)(local_d0._M_dataplus._M_p + 8))[1];
      iVar26 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                           *)local_a8,(key_arg<std::basic_string_view<char>_> *)VVar2.obj);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_a8);
      if (iVar26.ctrl_ != (ctrl_t *)0x0) {
        pcVar19 = *(char **)(*(long *)(local_d0._M_dataplus._M_p + 8) + 0x20);
        sVar5 = *(size_t *)(*(long *)(local_d0._M_dataplus._M_p + 8) + 0x28);
        pVVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                            (local_b0,(int)lVar20);
        local_a8._64_8_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
        ;
        make_error_02.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
        ;
        make_error_02.ptr_.obj = VVar2.obj;
        element_name_03._M_str = pcVar19;
        element_name_03._M_len = sVar5;
        local_a8._32_8_ = &local_d0;
        local_a8._56_8_ = VVar2.obj;
        AddError(this,element_name_03,&pVVar10->super_Message,NAME,make_error_02);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < *(int *)(local_d0._M_string_length + 4));
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_a8);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result,
                                  internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  // Calculate the continuous sequence of the labels.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_value_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // enums, but it is unlikely.
  for (int i = 0;
       i < std::numeric_limits<uint16_t>::max() && i < proto.value_size() &&
       // We do the math in int64_t to avoid overflows.
       proto.value(i).number() ==
           static_cast<int64_t>(i) + proto.value(0).number();
       ++i) {
    result->sequential_value_limit_ = i;
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  // Copy options.
  AllocateOptions(proto, result, EnumDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end(), range1.start(),
                       range1.end());
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Enum value \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(value->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Enum value \"$0\" uses reserved number $1.",
                       value->name(), value->number());
                 });
      }
    }
    if (reserved_name_set.contains(value->name())) {
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Enum value \"$0\" is reserved.",
                                         value->name());
               });
    }
  }
}